

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O2

int Cec_ManPatComputePattern3_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  iVar2 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar2 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    uVar3 = (uint)*(ulong *)pObj;
    if ((~uVar3 & 0x9fffffff) == 0) {
      *(ulong *)pObj = *(ulong *)pObj | 0x4000000040000000;
      uVar3 = 3;
    }
    else {
      if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecPat.c"
                      ,0x102,"int Cec_ManPatComputePattern3_rec(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar2 = Cec_ManPatComputePattern3_rec(p,pObj + -(ulong)(uVar3 & 0x1fffffff));
      iVar4 = Cec_ManPatComputePattern3_rec
                        (p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
      uVar1 = *(ulong *)pObj;
      uVar5 = (ulong)((iVar4 == 3 || iVar2 == 3) | 2);
      if (((uint)(uVar1 >> 0x3d) & 1) + 1 == iVar4) {
        uVar5 = 1;
      }
      if ((((uint)uVar1 >> 0x1d & 1) != 0) + 1 == iVar2) {
        uVar5 = 1;
      }
      uVar3 = (uint)uVar5;
      *(ulong *)pObj =
           (uVar5 >> 1) << 0x3e | uVar1 & 0xbfffffffbfffffff | (ulong)((uVar3 & 1) << 0x1e);
    }
  }
  else {
    uVar3 = (uint)(*(ulong *)pObj >> 0x1e) & 1 | (uint)(*(ulong *)pObj >> 0x3d) & 2;
  }
  return uVar3;
}

Assistant:

int Cec_ManPatComputePattern3_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int Value0, Value1, Value;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return (pObj->fMark1 << 1) | pObj->fMark0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        pObj->fMark0 = 1;
        pObj->fMark1 = 1;
        return GIA_UND;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Value0 = Cec_ManPatComputePattern3_rec( p, Gia_ObjFanin0(pObj) );
    Value1 = Cec_ManPatComputePattern3_rec( p, Gia_ObjFanin1(pObj) );
    Value = Gia_XsimAndCond( Value0, Gia_ObjFaninC0(pObj), Value1, Gia_ObjFaninC1(pObj) );
    pObj->fMark0 =  (Value & 1);
    pObj->fMark1 = ((Value >> 1) & 1);
    return Value;
}